

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_VariableNode *
getArgumentsVariableNode(UA_Server *server,UA_MethodNode *ofMethod,UA_String withBrowseName)

{
  UA_Boolean UVar1;
  UA_VariableNode *pUVar2;
  UA_Node *refTarget;
  size_t i;
  UA_NodeId hasProperty;
  UA_MethodNode *ofMethod_local;
  UA_Server *server_local;
  UA_String withBrowseName_local;
  
  withBrowseName_local.length = (size_t)withBrowseName.data;
  server_local = (UA_Server *)withBrowseName.length;
  hasProperty.identifier.string.data = (UA_Byte *)ofMethod;
  UA_NODEID_NUMERIC((UA_NodeId *)&i,0,0x2e);
  refTarget = (UA_Node *)0x0;
  while( true ) {
    if (*(UA_Node **)(hasProperty.identifier.string.data + 0x80) <= refTarget) {
      return (UA_VariableNode *)0x0;
    }
    if (((((*(byte *)(*(long *)(hasProperty.identifier.string.data + 0x88) + (long)refTarget * 0x50
                     + 0x18) & 1) == 0) &&
         (UVar1 = UA_NodeId_equal((UA_NodeId *)&i,
                                  (UA_NodeId *)
                                  (*(long *)(hasProperty.identifier.string.data + 0x88) +
                                  (long)refTarget * 0x50)), UVar1)) &&
        (pUVar2 = (UA_VariableNode *)
                  UA_NodeStore_get(server->nodestore,
                                   (UA_NodeId *)
                                   (*(long *)(hasProperty.identifier.string.data + 0x88) +
                                    (long)refTarget * 0x50 + 0x20)),
        pUVar2 != (UA_VariableNode *)0x0)) &&
       (((pUVar2->nodeClass == UA_NODECLASS_VARIABLE && ((pUVar2->browseName).namespaceIndex == 0))
        && (UVar1 = UA_String_equal((UA_String *)&server_local,&(pUVar2->browseName).name), UVar1)))
       ) break;
    refTarget = (UA_Node *)((long)&(refTarget->nodeId).namespaceIndex + 1);
  }
  return pUVar2;
}

Assistant:

static const UA_VariableNode *
getArgumentsVariableNode(UA_Server *server, const UA_MethodNode *ofMethod,
                         UA_String withBrowseName) {
    UA_NodeId hasProperty = UA_NODEID_NUMERIC(0, UA_NS0ID_HASPROPERTY);
    for(size_t i = 0; i < ofMethod->referencesSize; ++i) {
        if(ofMethod->references[i].isInverse == false &&
            UA_NodeId_equal(&hasProperty, &ofMethod->references[i].referenceTypeId)) {
            const UA_Node *refTarget =
                UA_NodeStore_get(server->nodestore, &ofMethod->references[i].targetId.nodeId);
            if(!refTarget)
                continue;
            if(refTarget->nodeClass == UA_NODECLASS_VARIABLE &&
                refTarget->browseName.namespaceIndex == 0 &&
                UA_String_equal(&withBrowseName, &refTarget->browseName.name)) {
                return (const UA_VariableNode*) refTarget;
            }
        }
    }
    return NULL;
}